

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O3

void __thiscall FPatchTexture::MakeTexture(FPatchTexture *this)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  BYTE *pBVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  FResourceFile **ppFVar12;
  ushort uVar13;
  uint *__dest;
  FMemLump lump;
  BYTE remaptable [256];
  FWadCollection local_140 [3];
  
  FWadCollection::ReadLump(local_140,0x1c70340);
  ppFVar12 = (FResourceFile **)0x0;
  if (*(int *)((long)local_140[0].Files.Array + -0xc) != 0) {
    ppFVar12 = local_140[0].Files.Array;
  }
  iVar3 = FWadCollection::LumpLength(&Wads,(this->super_FTexture).SourceLump);
  if (((this->super_FTexture).field_0x31 & 2) == 0) {
    __dest = (uint *)GPalette.Remap;
  }
  else {
    __dest = &local_140[0].Files.Most;
    memcpy(__dest,GPalette.Remap,0x100);
    local_140[0].Files.Most._0_1_ = 0;
  }
  uVar13 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  if (this->hackflag == true) {
    pBVar4 = (BYTE *)operator_new__((ulong)uVar2 * (ulong)uVar13);
    this->Pixels = pBVar4;
    if (uVar13 != 0) {
      uVar5 = 0;
      do {
        uVar2 = (this->super_FTexture).Height;
        if (uVar2 != 0) {
          pbVar8 = (byte *)((long)ppFVar12 + (ulong)*(uint *)((long)ppFVar12 + uVar5 * 4 + 8) + 3);
          uVar7 = uVar2 + 1;
          do {
            *pBVar4 = *(BYTE *)((long)__dest + (ulong)*pbVar8);
            pBVar4 = pBVar4 + 1;
            pbVar8 = pbVar8 + 1;
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
          uVar13 = (this->super_FTexture).Width;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar13);
    }
  }
  else {
    uVar5 = (ulong)(int)((uVar13 - 1) * (uint)uVar2 +
                        (1 << ((this->super_FTexture).HeightBits & 0x1f)));
    pBVar4 = (BYTE *)operator_new__(uVar5);
    this->Pixels = pBVar4;
    memset(pBVar4,0,uVar5);
    if (uVar13 != 0) {
      pbVar8 = (byte *)((long)ppFVar12 + (long)iVar3 + -3);
      uVar5 = 0;
      do {
        pbVar6 = (byte *)((long)ppFVar12 + (ulong)*(uint *)((long)ppFVar12 + uVar5 * 4 + 8));
        if (pbVar6 < pbVar8) {
          uVar13 = (this->super_FTexture).Height;
          pBVar4 = this->Pixels;
          iVar3 = -1;
          do {
            bVar1 = *pbVar6;
            if (bVar1 == 0xff) break;
            if (iVar3 < (int)(uint)bVar1) {
              iVar3 = 0;
            }
            iVar3 = iVar3 + (uint)bVar1;
            uVar9 = (uint)pbVar6[1];
            uVar7 = 0;
            if (pbVar6[1] != 0) {
              uVar7 = (uint)(this->super_FTexture).Height;
              uVar10 = uVar7 - iVar3;
              if ((int)(iVar3 + uVar9) <= (int)uVar7) {
                uVar10 = uVar9;
              }
              uVar7 = uVar9;
              if (0 < (int)uVar10) {
                uVar11 = 0;
                do {
                  pBVar4[uVar11 + (long)iVar3 + uVar13 * uVar5] =
                       *(BYTE *)((long)__dest + (ulong)pbVar6[uVar11 + 3]);
                  uVar11 = uVar11 + 1;
                } while (uVar11 < uVar10);
                uVar7 = (uint)pbVar6[1];
              }
            }
            pbVar6 = pbVar6 + (ulong)uVar7 + 4;
          } while (pbVar6 < pbVar8);
          uVar13 = (this->super_FTexture).Width;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar13);
    }
  }
  FMemLump::~FMemLump((FMemLump *)local_140);
  return;
}

Assistant:

void FPatchTexture::MakeTexture ()
{
	BYTE *remap, remaptable[256];
	int numspans;
	const column_t *maxcol;
	int x;

	FMemLump lump = Wads.ReadLump (SourceLump);
	const patch_t *patch = (const patch_t *)lump.GetMem();

	maxcol = (const column_t *)((const BYTE *)patch + Wads.LumpLength (SourceLump) - 3);

	// Check for badly-sized patches
#if 0	// Such textures won't be created so there's no need to check here
	if (LittleShort(patch->width) <= 0 || LittleShort(patch->height) <= 0)
	{
		lump = Wads.ReadLump ("-BADPATC");
		patch = (const patch_t *)lump.GetMem();
		Printf (PRINT_BOLD, "Patch %s has a non-positive size.\n", Name);
	}
	else if (LittleShort(patch->width) > 2048 || LittleShort(patch->height) > 2048)
	{
		lump = Wads.ReadLump ("-BADPATC");
		patch = (const patch_t *)lump.GetMem();
		Printf (PRINT_BOLD, "Patch %s is too big.\n", Name);
	}
#endif

	if (bNoRemap0)
	{
		memcpy (remaptable, GPalette.Remap, 256);
		remaptable[0] = 0;
		remap = remaptable;
	}
	else
	{
		remap = GPalette.Remap;
	}


	if (hackflag)
	{
		Pixels = new BYTE[Width * Height];
		BYTE *out;

		// Draw the image to the buffer
		for (x = 0, out = Pixels; x < Width; ++x)
		{
			const BYTE *in = (const BYTE *)patch + LittleLong(patch->columnofs[x]) + 3;

			for (int y = Height; y > 0; --y)
			{
				*out = remap[*in];
				out++, in++;
			}
		}
		return;
	}

	// Add a little extra space at the end if the texture's height is not
	// a power of 2, in case somebody accidentally makes it repeat vertically.
	int numpix = Width * Height + (1 << HeightBits) - Height;

	numspans = Width;

	Pixels = new BYTE[numpix];
	memset (Pixels, 0, numpix);

	// Draw the image to the buffer
	for (x = 0; x < Width; ++x)
	{
		BYTE *outtop = Pixels + x*Height;
		const column_t *column = (const column_t *)((const BYTE *)patch + LittleLong(patch->columnofs[x]));
		int top = -1;

		while (column < maxcol && column->topdelta != 0xFF)
		{
			if (column->topdelta <= top)
			{
				top += column->topdelta;
			}
			else
			{
				top = column->topdelta;
			}

			int len = column->length;
			BYTE *out = outtop + top;

			if (len != 0)
			{
				if (top + len > Height)	// Clip posts that extend past the bottom
				{
					len = Height - top;
				}
				if (len > 0)
				{
					numspans++;

					const BYTE *in = (const BYTE *)column + 3;
					for (int i = 0; i < len; ++i)
					{
						out[i] = remap[in[i]];
					}
				}
			}
			column = (const column_t *)((const BYTE *)column + column->length + 4);
		}
	}
}